

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv)

{
  REF_GRID pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  bool bVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  uint uVar6;
  uint uVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  uint uVar10;
  byte bVar11;
  REF_INT *pRVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  byte bVar16;
  REF_NODE ref_node;
  int cell_edge;
  int iVar17;
  uint uVar18;
  long lVar19;
  int cell;
  REF_INT nmark_1;
  REF_INT new_nodes [27];
  REF_INT nmark;
  REF_INT e5;
  REF_INT e4;
  REF_INT e3;
  REF_INT e2;
  REF_INT e1;
  REF_INT e0;
  REF_INT nodes [27];
  REF_DBL local_250;
  uint local_244;
  REF_NODE local_240;
  REF_GRID local_238;
  REF_BOOL local_22c;
  REF_NODE local_228;
  uint local_21c;
  REF_DBL local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  REF_DBL local_1f8;
  REF_DBL local_1f0;
  REF_INT local_1e8 [30];
  REF_DBL local_170;
  uint local_168;
  uint local_164;
  REF_INT local_160;
  REF_INT local_15c;
  REF_INT local_158;
  REF_INT local_154;
  REF_INT local_150;
  REF_INT local_14c;
  REF_INT local_148;
  REF_INT RStack_144;
  REF_INT RStack_140;
  REF_INT RStack_13c;
  REF_DBL local_d8;
  undefined8 uStack_d0;
  REF_DBL local_c8;
  undefined8 uStack_c0;
  ulong local_b0;
  REF_DBL local_a8;
  undefined8 uStack_a0;
  REF_DBL local_98;
  undefined8 uStack_90;
  REF_DBL local_80;
  REF_DBL local_78;
  REF_DBL local_70;
  REF_DBL local_68;
  REF_DBL local_60;
  REF_DBL local_58;
  undefined8 uStack_50;
  REF_DBL local_48;
  undefined8 uStack_40;
  
  pRVar1 = ref_subdiv->grid;
  ref_node = pRVar1->node;
  uVar6 = ref_node_synchronize_globals(ref_node);
  if (uVar6 != 0) {
    pcVar15 = "sync glob for mark relax";
    uVar13 = 0x861;
    uVar14 = (ulong)uVar6;
LAB_001e57fa:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar13
           ,"ref_subdiv_split",uVar14,pcVar15);
    return uVar6;
  }
  if (ref_subdiv->instrument != 0) {
    uVar6 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_164);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x864,"ref_subdiv_split",(ulong)uVar6,"count");
      return uVar6;
    }
    if (ref_subdiv->grid->mpi->id == 0) {
      printf(" %d edges marked before relaxation\n",(ulong)local_164);
    }
  }
  uVar6 = 0;
  local_238 = pRVar1;
  local_228 = ref_node;
  if (ref_subdiv->allow_geometry == 0) {
    uVar7 = ref_subdiv_unmark_geom_support(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x873,"ref_subdiv_split",(ulong)uVar7,"all geom marks");
      return uVar7;
    }
    if ((ref_subdiv->new_mark_allowed != 0) &&
       (uVar7 = ref_subdiv_mark_relax(ref_subdiv), uVar7 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x875,"ref_subdiv_split",(ulong)uVar7,"relax marks");
      return uVar7;
    }
    uVar7 = ref_subdiv_unmark_geom_support(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x877,"ref_subdiv_split",(ulong)uVar7,"all geom marks");
      return uVar7;
    }
    uVar7 = ref_subdiv_unmark_relax(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x878,"ref_subdiv_split",(ulong)uVar7,"relax marks");
      return uVar7;
    }
    uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x879,"ref_subdiv_split",(ulong)uVar7,"possible");
      return uVar7;
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 == 0) goto LAB_001e6f86;
    uVar13 = 0x87a;
    uVar6 = uVar7;
  }
  else {
    if (ref_subdiv->new_mark_allowed != 0) {
      uVar7 = ref_subdiv_mark_relax(ref_subdiv);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x86b,"ref_subdiv_split",(ulong)uVar7,"relax marks");
        return uVar7;
      }
      uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x86c,"ref_subdiv_split",(ulong)uVar7,"possible");
        return uVar7;
      }
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x86e,"ref_subdiv_split",(ulong)uVar7,"new nodes");
      return uVar7;
    }
    local_22c = 1;
    uVar14 = 0;
    local_244 = uVar6;
    do {
      local_b0 = uVar14;
      if (local_22c == 0) {
        uVar7 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
        if (uVar7 == 0) {
          if (ref_subdiv->instrument == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_21c);
            if (uVar7 == 0) {
              uVar7 = 0;
              if (ref_subdiv->grid->mpi->id == 0) {
                uVar7 = 0;
                printf(" %d edges marked after %d neg geom tet unmark relaxations\n",
                       (ulong)local_21c,local_b0);
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x350,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar7,"count");
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x34d,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar7,"ghost mark");
        }
        break;
      }
      local_22c = 0;
      uVar7 = ref_subdiv_unmark_relax(ref_subdiv);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x334,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar7,"unmark relax inside neg tet");
        break;
      }
      ref_cell = ref_subdiv->grid->cell[8];
      local_168 = (uint)ref_node;
      if (0 < ref_cell->max) {
        local_240 = ref_subdiv->grid->node;
        cell = 0;
        do {
          if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
            RVar8 = ref_subdiv_map(ref_subdiv,ref_cell,cell);
            uVar7 = ref_cell_nodes(ref_cell,cell,&local_148);
            RVar5 = RStack_140;
            RVar4 = RStack_144;
            RVar9 = local_148;
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x277,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"nodes");
              goto LAB_001e6c23;
            }
            uVar14 = 0;
            if (RVar8 < 0x15) {
              if (RVar8 < 8) {
                if ((RVar8 - 1U < 2) || (RVar8 == 4)) goto LAB_001e6467;
              }
              else {
                if (RVar8 != 8) {
                  if (RVar8 == 0xb) goto LAB_001e664f;
                  if (RVar8 != 0x10) goto LAB_001e6bc9;
                }
LAB_001e6467:
                if (ref_cell->edge_per < 1) {
                  iVar17 = -1;
                }
                else {
                  iVar17 = -1;
                  cell_edge = 0;
                  do {
                    pRVar12 = ref_subdiv->mark;
                    RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,cell);
                    if (pRVar12[RVar9] != 0) {
                      iVar17 = cell_edge;
                    }
                    cell_edge = cell_edge + 1;
                  } while (cell_edge < ref_cell->edge_per);
                }
                if (iVar17 == -1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x286,"ref_subdiv_unmark_neg_tet_geom_support","edge not found");
                  uVar7 = 1;
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,iVar17,cell);
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                local_1e8[ref_cell->e2n[iVar17 * 2]] = ref_subdiv->node[RVar9];
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x28c,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_218 = (REF_DBL)CONCAT44(local_218._4_4_,
                                              (uint)(local_250 < local_240->min_volume));
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                local_1e8[ref_cell->e2n[(int)(iVar17 * 2 | 1)]] = ref_subdiv->node[RVar9];
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x292,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                uVar6 = local_244;
                if (local_250 < local_240->min_volume) goto LAB_001e6b9a;
                uVar14 = (ulong)local_218 & 0xffffffff;
              }
            }
            else {
              uVar14 = 0;
              if (RVar8 < 0x26) {
                if (RVar8 != 0x15) {
                  if (RVar8 == 0x20) goto LAB_001e6467;
                  goto LAB_001e6bc9;
                }
                RStack_140 = RStack_13c;
                RStack_13c = RVar5;
                local_148 = RStack_144;
                RStack_144 = RVar9;
LAB_001e664f:
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_144,local_1e8 + 1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2ac,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_140,local_1e8 + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2af,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2b0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                local_218 = local_240->min_volume;
                local_208._0_8_ = local_250;
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_144,local_148,local_1e8);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2b7,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_140,local_1e8 + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2ba,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,699,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                local_d8 = local_240->min_volume;
                uStack_d0 = 0;
                local_c8 = local_250;
                uStack_c0 = 0;
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_140,local_148,local_1e8);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2c2,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_140,RStack_144,local_1e8 + 1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2c5,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2c6,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                bVar16 = (double)local_208._0_8_ < local_218;
                local_208._8_8_ = 0;
                local_208._0_8_ = local_240->min_volume;
                local_1e8[0] = local_148;
                local_1e8[1] = RStack_144;
                local_1e8[2] = RStack_140;
                local_1e8[3] = RStack_13c;
                local_218 = local_250;
                uStack_210 = 0;
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_144,local_1e8);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2cd,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_140,local_1e8 + 1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2d0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_140,local_148,local_1e8 + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2d3,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"mis");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2d4,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                if (local_240->min_volume <= local_250) {
                  bVar11 = -(local_218 < (double)local_208._0_8_) | -(local_c8 < local_d8);
LAB_001e6bc6:
                  uVar14 = (ulong)(bVar11 | bVar16);
                  goto LAB_001e6bc9;
                }
              }
              else {
                if (RVar8 == 0x26) {
                  local_148 = RStack_140;
                  RStack_144 = RStack_13c;
                  RStack_140 = RVar9;
                  RStack_13c = RVar4;
                  goto LAB_001e664f;
                }
                if (RVar8 == 0x38) {
                  local_148 = RStack_13c;
                  RStack_13c = RVar9;
                  RStack_144 = RStack_140;
                  RStack_140 = RVar4;
                  goto LAB_001e664f;
                }
                if (RVar8 != 0x3f) goto LAB_001e6bc9;
                local_1f0 = (REF_DBL)CONCAT44(local_1f0._4_4_,RStack_140);
                local_1f8 = (REF_DBL)CONCAT44(local_1f8._4_4_,RStack_13c);
                local_218 = (REF_DBL)CONCAT44(local_218._4_4_,local_148);
                local_208._0_4_ = RStack_144;
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_144,&local_14c);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2dd,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_140,&local_150);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2de,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_13c,&local_154);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2df,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_140,&local_158);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2e0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  goto LAB_001e6c23;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_13c,&local_15c);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2e1,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  goto LAB_001e6c23;
                }
                pRVar12 = &local_160;
                uVar7 = ref_subdiv_node_between(ref_subdiv,RStack_140,RStack_13c,pRVar12);
                RVar4 = local_14c;
                RVar9 = local_154;
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2e2,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"e");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_1e8[0] = local_14c;
                local_1e8[1] = local_154;
                local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,local_150);
                local_1e8[2] = local_150;
                local_1e8[3] = local_218._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2e7,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_170 = local_240->min_volume;
                local_98 = local_250;
                local_1e8[0] = RVar4;
                local_d8 = (REF_DBL)CONCAT44(local_d8._4_4_,local_158);
                local_1e8[1] = local_158;
                local_218 = (REF_DBL)CONCAT44(local_218._4_4_,local_15c);
                local_1e8[2] = local_15c;
                local_1e8[3] = local_208._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2ee,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_a8 = local_240->min_volume;
                local_60 = local_250;
                local_1e8[0] = local_c8._0_4_;
                local_208._0_4_ = local_160;
                local_1e8[1] = local_160;
                local_1e8[2] = local_d8._0_4_;
                local_1e8[3] = local_1f0._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2f5,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_1f0 = local_240->min_volume;
                local_68 = local_250;
                local_1e8[0] = RVar9;
                local_1e8[1] = local_218._0_4_;
                local_1e8[2] = local_208._0_4_;
                local_1e8[3] = local_1f8._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x2fc,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_1f8 = local_240->min_volume;
                local_70 = local_250;
                local_1e8[0] = RVar4;
                local_1e8[1] = local_208._0_4_;
                local_1e8[2] = local_c8._0_4_;
                local_1e8[3] = RVar9;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x303,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_78 = local_240->min_volume;
                local_80 = local_250;
                local_1e8[0] = RVar4;
                local_1e8[1] = local_208._0_4_;
                local_1e8[2] = RVar9;
                local_1e8[3] = local_218._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                uVar6 = local_244;
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x30a,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  uVar6 = local_244;
                  goto LAB_001e6c23;
                }
                local_58 = local_240->min_volume;
                uStack_50 = 0;
                local_48 = local_250;
                uStack_40 = 0;
                local_1e8[0] = RVar4;
                local_1e8[1] = local_208._0_4_;
                local_1e8[2] = local_218._0_4_;
                local_1e8[3] = local_d8._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x311,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                bVar3 = local_80 < local_78;
                local_1f8 = (REF_DBL)CONCAT71(local_1f8._1_7_,local_70 < local_1f8);
                local_1f0 = (REF_DBL)CONCAT71(local_1f0._1_7_,local_68 < local_1f0);
                local_218 = (REF_DBL)CONCAT44(local_218._4_4_,
                                              (int)CONCAT71((int7)((ulong)pRVar12 >> 8),
                                                            local_60 < local_a8));
                local_170 = (REF_DBL)CONCAT71(local_170._1_7_,local_98 < local_170);
                local_a8 = local_240->min_volume;
                uStack_a0 = 0;
                local_98 = local_250;
                uStack_90 = 0;
                local_1e8[0] = RVar4;
                local_1e8[1] = local_208._0_4_;
                local_1e8[2] = local_d8._0_4_;
                local_1e8[3] = local_c8._0_4_;
                uVar7 = ref_node_tet_vol(local_240,local_1e8,&local_250);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x318,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar7,"split vol");
                  goto LAB_001e6c23;
                }
                if (local_240->min_volume <= local_250) {
                  bVar16 = bVar3 | local_1f8._0_1_ | local_1f0._0_1_ |
                           -(local_98 < local_a8) | -(local_48 < local_58);
                  bVar11 = SUB81(local_218,0) | local_170._0_1_;
                  goto LAB_001e6bc6;
                }
              }
LAB_001e6b9a:
              uVar14 = 1;
            }
LAB_001e6bc9:
            if (((uVar14 & 1) != 0) && (local_22c = 1, 0 < ref_cell->edge_per)) {
              iVar17 = 0;
              do {
                pRVar12 = ref_subdiv->mark;
                RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,iVar17,cell);
                pRVar12[RVar9] = 0;
                iVar17 = iVar17 + 1;
              } while (iVar17 < ref_cell->edge_per);
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      uVar7 = 0;
LAB_001e6c23:
      uVar18 = local_168;
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x337,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar7,"neg geom");
        break;
      }
      uVar10 = ref_edge_ghost_min_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
      uVar7 = uVar18;
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x33c,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar10,"ghost mark");
        uVar7 = uVar10;
      }
      ref_node = (REF_NODE)(ulong)uVar7;
      if (uVar10 != 0) break;
      uVar18 = (uint)local_b0 + 1;
      if (4 < (uint)local_b0) {
        uVar10 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_21c);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x33f,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar10,"count");
          ref_node = (REF_NODE)(ulong)uVar10;
        }
        uVar7 = (uint)ref_node;
        if (uVar10 != 0) break;
        if (ref_subdiv->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark neg geom tet relaxations\n",(ulong)local_21c,
                 (ulong)uVar18);
        }
      }
      if (uVar18 == 200) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x345,"ref_subdiv_unmark_neg_tet_relax",
               "too many unmark neg geom tet sweeps, stop inf loop");
        uVar7 = 1;
        break;
      }
      uVar10 = ref_mpi_all_or(ref_subdiv->grid->mpi,&local_22c);
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x347,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar10,"mpi all or");
        ref_node = (REF_NODE)(ulong)uVar10;
      }
      uVar7 = (uint)ref_node;
      uVar14 = (ulong)uVar18;
    } while (uVar10 == 0);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x86f,"ref_subdiv_split",(ulong)uVar7,"geom neg marks");
      return uVar7;
    }
    uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x870,"ref_subdiv_split",(ulong)uVar7,"possible");
      return uVar7;
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 == 0) goto LAB_001e6f86;
    uVar13 = 0x871;
    uVar6 = uVar7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar13,
         "ref_subdiv_split",(ulong)uVar6,"new nodes");
  uVar7 = uVar6;
LAB_001e6f86:
  if (uVar7 == 0) {
    uVar6 = ref_subdiv_split_tet(ref_subdiv);
    if (uVar6 == 0) {
      uVar6 = ref_subdiv_split_pri(ref_subdiv);
      if (uVar6 == 0) {
        uVar6 = ref_subdiv_split_pyr(ref_subdiv);
        if (uVar6 == 0) {
          uVar6 = ref_subdiv_split_qua(ref_subdiv);
          if (uVar6 == 0) {
            uVar6 = ref_subdiv_split_tri(ref_subdiv);
            if (uVar6 == 0) {
              uVar6 = ref_subdiv_split_edg(ref_subdiv);
              if (uVar6 == 0) {
                if (local_228->max < 1) {
                  uVar6 = 0;
                }
                else {
                  lVar19 = 0;
                  do {
                    if (((-1 < local_228->global[lVar19]) &&
                        ((pRVar2 = local_238->cell[8]->ref_adj, pRVar2->nnode <= lVar19 ||
                         (pRVar2->first[lVar19] == -1)))) &&
                       (((pRVar2 = local_238->cell[9]->ref_adj, pRVar2->nnode <= lVar19 ||
                         (pRVar2->first[lVar19] == -1)) &&
                        (((pRVar2 = local_238->cell[10]->ref_adj, pRVar2->nnode <= lVar19 ||
                          (pRVar2->first[lVar19] == -1)) &&
                         ((pRVar2 = local_238->cell[0xb]->ref_adj, pRVar2->nnode <= lVar19 ||
                          (pRVar2->first[lVar19] == -1)))))))) {
                      if (ref_subdiv->grid->mpi->id == local_228->part[lVar19]) {
                        pcVar15 = "unused local node";
                        uVar13 = 0x890;
                      }
                      else {
                        pRVar2 = local_238->cell[3]->ref_adj;
                        if (((pRVar2->nnode <= lVar19) || (pRVar2->first[lVar19] == -1)) &&
                           ((pRVar2 = local_238->cell[6]->ref_adj, pRVar2->nnode <= lVar19 ||
                            (pRVar2->first[lVar19] == -1)))) {
                          uVar6 = ref_node_remove_without_global(local_228,(REF_INT)lVar19);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x896,"ref_subdiv_split",(ulong)uVar6,"rm");
                            return uVar6;
                          }
                          uVar6 = ref_geom_remove_all(local_238->geom,(REF_INT)lVar19);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x897,"ref_subdiv_split",(ulong)uVar6,"rm");
                            return uVar6;
                          }
                          goto LAB_001e72eb;
                        }
                        pcVar15 = "boundary face node not in vol cells";
                        uVar13 = 0x894;
                      }
                      uVar6 = 1;
                      uVar14 = 1;
                      goto LAB_001e57fa;
                    }
LAB_001e72eb:
                    lVar19 = lVar19 + 1;
                    uVar6 = 0;
                  } while (lVar19 < local_228->max);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x886,"ref_subdiv_split",(ulong)uVar6,"split edg");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x884,"ref_subdiv_split",(ulong)uVar6,"split tri");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x882,"ref_subdiv_split",(ulong)uVar6,"split qua");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x880,"ref_subdiv_split",(ulong)uVar6,"split pyr");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x87e,"ref_subdiv_split",(ulong)uVar6,"split pri");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x87d,"ref_subdiv_split",(ulong)uVar6,"split tet");
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT node;
  REF_INT nmark;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob for mark relax");

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked before relaxation\n", nmark);
  }

  if (ref_subdiv->allow_geometry) {
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
      RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    }
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
    RSS(ref_subdiv_unmark_neg_tet_relax(ref_subdiv), "geom neg marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  } else {
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
    }
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    RSS(ref_subdiv_unmark_relax(ref_subdiv), "relax marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  }

  RSS(ref_subdiv_split_tet(ref_subdiv), "split tet");
  RSS(ref_subdiv_split_pri(ref_subdiv), "split pri");
  /* pyr comes last, it can make other elements too */
  RSS(ref_subdiv_split_pyr(ref_subdiv), "split pyr");

  RSS(ref_subdiv_split_qua(ref_subdiv), "split qua");
  /* tri comes last, it can make qua elements too */
  RSS(ref_subdiv_split_tri(ref_subdiv), "split tri");

  RSS(ref_subdiv_split_edg(ref_subdiv), "split edg");

  /* remove unused nodes on partition boundaries */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      if (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
          ref_node_part(ref_node, node)) {
        RSS(REF_FAILURE, "unused local node");
      }
      if (!ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) ||
          !ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node)) {
        RSS(REF_FAILURE, "boundary face node not in vol cells");
      }
      RSS(ref_node_remove_without_global(ref_node, node), "rm");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm");
    }
  }

  return REF_SUCCESS;
}